

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall
happly::TypedListProperty<signed_char>::readNextBigEndian
          (TypedListProperty<signed_char> *this,istream *stream)

{
  undefined1 uVar1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  ushort uVar5;
  undefined8 *puVar6;
  long lVar7;
  size_t afterSize;
  size_t count;
  undefined8 local_30;
  ulong local_28;
  
  local_28 = 0;
  std::istream::read((char *)stream,(long)&local_28);
  iVar2 = this->listCountBytes;
  if (iVar2 == 2) {
    uVar5 = swap_bytes((undefined2)local_28);
    local_28 = (ulong)uVar5;
  }
  else if (iVar2 == 4) {
    puVar6 = &local_30;
    local_30 = (pointer)CONCAT44(local_30._4_4_,(undefined4)local_28);
    lVar7 = 3;
    do {
      uVar1 = *(undefined1 *)((long)&local_30 + lVar7);
      *(undefined1 *)((long)&local_30 + lVar7) = *(undefined1 *)puVar6;
      *(undefined1 *)puVar6 = uVar1;
      lVar7 = lVar7 + -1;
      puVar6 = (undefined8 *)((long)puVar6 + 1);
    } while (lVar7 == 2);
    local_28 = (ulong)local_30 & 0xffffffff;
  }
  else if (iVar2 == 8) {
    puVar6 = &local_30;
    local_30 = (pointer)local_28;
    lVar7 = 7;
    do {
      uVar1 = *(undefined1 *)((long)&local_30 + lVar7);
      *(undefined1 *)((long)&local_30 + lVar7) = *(undefined1 *)puVar6;
      *(undefined1 *)puVar6 = uVar1;
      lVar7 = lVar7 + -1;
      puVar6 = (undefined8 *)((long)puVar6 + 1);
      local_28 = (ulong)local_30;
    } while (lVar7 != 3);
  }
  pcVar3 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = (this->flattenedData).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_30 = pcVar3 + (local_28 - (long)pcVar4);
  geometrycentral::surface::std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->flattenedData,(size_type)local_30);
  if (local_28 != 0) {
    std::istream::read((char *)stream,
                       (long)(pcVar3 + ((long)(this->flattenedData).
                                              super__Vector_base<signed_char,_std::allocator<signed_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)pcVar4)));
  }
  __position._M_current =
       (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->flattenedIndexStart,
               __position,&local_30);
  }
  else {
    *__position._M_current = (unsigned_long)local_30;
    (this->flattenedIndexStart).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void readNextBigEndian(std::istream& stream) override {

    // Read the size of the list
    size_t count = 0;
    stream.read(((char*)&count), listCountBytes);
    if (listCountBytes == 8) {
      count = (size_t)swapEndian((uint64_t)count);
    } else if (listCountBytes == 4) {
      count = (size_t)swapEndian((uint32_t)count);
    } else if (listCountBytes == 2) {
      count = (size_t)swapEndian((uint16_t)count);
    }

    // Read list elements
    size_t currSize = flattenedData.size();
    size_t afterSize = currSize + count;
    flattenedData.resize(afterSize);
    if (count > 0) {
      stream.read((char*)&flattenedData[currSize], count * sizeof(T));
    }
    flattenedIndexStart.emplace_back(afterSize);

    // Swap endian order of list elements
    for (size_t iFlat = currSize; iFlat < afterSize; iFlat++) {
      flattenedData[iFlat] = swapEndian(flattenedData[iFlat]);
    }
  }